

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# module-utils.h
# Opt level: O0

unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_> __thiscall
wasm::ModuleUtils::
ParallelFunctionAnalysis<Info,_(wasm::Mutability)0,_wasm::ModuleUtils::DefaultMap>::doAnalysis::
Mapper::create(Mapper *this)

{
  long in_RSI;
  Mapper *this_local;
  
  this_local = (Mapper *)this;
  std::
  make_unique<wasm::ModuleUtils::ParallelFunctionAnalysis<wasm::(anonymous_namespace)::SignaturePruning::iteration(wasm::Module*)::Info,(wasm::Mutability)0,wasm::ModuleUtils::DefaultMap>::doAnalysis(std::function<void(wasm::Function*,wasm::(anonymous_namespace)::SignaturePruning::iteration(wasm::Module*)::Info&)>)::Mapper,wasm::Module&,std::map<wasm::Function*,wasm::(anonymous_namespace)::SignaturePruning::iteration(wasm::Module*)::Info,std::less<wasm::Function*>,std::allocator<std::pair<wasm::Function*const,wasm::(anonymous_namespace)::SignaturePruning::iteration(wasm::Module*)::Info>>>&,std::function<void(wasm::Function*,wasm::(anonymous_namespace)::SignaturePruning::iteration(wasm::Module*)::Info&)>&>
            ((Module *)&stack0xffffffffffffffe0,
             *(map<wasm::Function_*,_Info,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_Info>_>_>
               **)(in_RSI + 0x130),
             *(function<void_(wasm::Function_*,_Info_&)>_conflict **)(in_RSI + 0x138));
  std::unique_ptr<wasm::Pass,std::default_delete<wasm::Pass>>::
  unique_ptr<wasm::ModuleUtils::ParallelFunctionAnalysis<wasm::(anonymous_namespace)::SignaturePruning::iteration(wasm::Module*)::Info,(wasm::Mutability)0,wasm::ModuleUtils::DefaultMap>::doAnalysis(std::function<void(wasm::Function*,wasm::(anonymous_namespace)::SignaturePruning::iteration(wasm::Module*)::Info&)>)::Mapper,std::default_delete<wasm::ModuleUtils::ParallelFunctionAnalysis<wasm::(anonymous_namespace)::SignaturePruning::iteration(wasm::Module*)::Info,(wasm::Mutability)0,wasm::ModuleUtils::DefaultMap>::doAnalysis(std::function<void(wasm::Function*,wasm::(anonymous_namespace)::SignaturePruning::iteration(wasm::Module*)::Info&)>)::Mapper>,void>
            ((unique_ptr<wasm::Pass,std::default_delete<wasm::Pass>> *)this,
             (unique_ptr<Mapper,_std::default_delete<Mapper>_> *)&stack0xffffffffffffffe0);
  std::unique_ptr<Mapper,_std::default_delete<Mapper>_>::~unique_ptr
            ((unique_ptr<Mapper,_std::default_delete<Mapper>_> *)&stack0xffffffffffffffe0);
  return (__uniq_ptr_data<wasm::Pass,_std::default_delete<wasm::Pass>,_true,_true>)
         (__uniq_ptr_data<wasm::Pass,_std::default_delete<wasm::Pass>,_true,_true>)this;
}

Assistant:

std::unique_ptr<Pass> create() override {
        return std::make_unique<Mapper>(module, map, work);
      }